

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O1

int pk_write_ec_pubkey(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  uchar buf [133];
  size_t local_a0;
  uchar local_98 [136];
  
  local_a0 = 0;
  iVar2 = mbedtls_ecp_point_write_binary(&ec->grp,&ec->Q,0,&local_a0,local_98,0x85);
  if (iVar2 == 0) {
    puVar1 = *p;
    iVar2 = -0x6c;
    if ((start <= puVar1) && (local_a0 <= (ulong)((long)puVar1 - (long)start))) {
      *p = puVar1 + -local_a0;
      memcpy(puVar1 + -local_a0,local_98,local_a0);
      iVar2 = (int)local_a0;
    }
  }
  return iVar2;
}

Assistant:

static int pk_write_ec_pubkey( unsigned char **p, unsigned char *start,
                               mbedtls_ecp_keypair *ec )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    unsigned char buf[MBEDTLS_ECP_MAX_PT_LEN];

    if( ( ret = mbedtls_ecp_point_write_binary( &ec->grp, &ec->Q,
                                        MBEDTLS_ECP_PF_UNCOMPRESSED,
                                        &len, buf, sizeof( buf ) ) ) != 0 )
    {
        return( ret );
    }

    if( *p < start || (size_t)( *p - start ) < len )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *p -= len;
    memcpy( *p, buf, len );

    return( (int) len );
}